

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall
ON_PolyCurve::GetCurveParameterFromNurbFormParameter
          (ON_PolyCurve *this,double nurbs_t,double *curve_t)

{
  ON_Curve *pOVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  ON_Interval cdom;
  ON_Interval in;
  ON_Interval local_38;
  ON_Interval local_28;
  
  iVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar4 = ON_SearchMonotoneArray((this->m_t).m_a,(this->m_t).m_count,nurbs_t);
  uVar7 = iVar6 - 1;
  if ((int)uVar4 < iVar6) {
    uVar7 = uVar4;
  }
  uVar5 = 0;
  if ((int)uVar4 < 0) {
    uVar7 = uVar5;
  }
  if (((int)uVar7 < 0) || ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)uVar7)
     ) goto LAB_0058adda;
  pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7];
  if (pOVar1 != (ON_Curve *)0x0) {
    pdVar2 = (this->m_t).m_a;
    dVar8 = pdVar2[(ulong)uVar7 + 1];
    ON_Interval::ON_Interval(&local_28,pdVar2[uVar7],dVar8);
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
    local_38.m_t[1] = dVar8;
    bVar3 = ON_Interval::operator!=(&local_28,&local_38);
    if (!bVar3) {
      uVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])
                        (nurbs_t,pOVar1,curve_t);
      goto LAB_0058adda;
    }
    ON_Interval::TransformParameterTo(&local_28,&local_38,nurbs_t);
    iVar6 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])(pOVar1,curve_t);
    if ((char)iVar6 != '\0') {
      dVar8 = ON_Interval::TransformParameterTo(&local_38,&local_28,*curve_t);
      *curve_t = dVar8;
      uVar5 = 1;
      goto LAB_0058adda;
    }
  }
  uVar5 = 0;
LAB_0058adda:
  return SUB41(uVar5,0);
}

Assistant:

bool ON_PolyCurve::GetCurveParameterFromNurbFormParameter(
      double nurbs_t,
      double* curve_t
      ) const
{
  bool rc = false;
  int i = SegmentIndex( nurbs_t );
  const ON_Curve* curve = SegmentCurve(i);
  if ( curve ) {
    ON_Interval in( m_t[i], m_t[i+1] );
    ON_Interval cdom = curve->Domain();
    if ( in != cdom ) {

      nurbs_t = in.TransformParameterTo(cdom, nurbs_t);
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
      if (rc)
        *curve_t = cdom.TransformParameterTo(in, *curve_t);
    }
    else {
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
    }
  }
  return rc;
}